

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

void ClearMetadata(VP8LMetadata *hdr)

{
  WebPSafeFree((void *)0x123042);
  WebPSafeFree((void *)0x12304f);
  VP8LHtreeGroupsFree((HTreeGroup *)0x12305c);
  VP8LColorCacheClear((VP8LColorCache *)0x123069);
  VP8LColorCacheClear((VP8LColorCache *)0x123076);
  InitMetadata((VP8LMetadata *)0x12307f);
  return;
}

Assistant:

static void ClearMetadata(VP8LMetadata* const hdr) {
  assert(hdr != NULL);

  WebPSafeFree(hdr->huffman_image_);
  WebPSafeFree(hdr->huffman_tables_);
  VP8LHtreeGroupsFree(hdr->htree_groups_);
  VP8LColorCacheClear(&hdr->color_cache_);
  VP8LColorCacheClear(&hdr->saved_color_cache_);
  InitMetadata(hdr);
}